

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  InternalMetadata *this_00;
  ulong uVar1;
  Arena *pAVar2;
  Arena *pAVar3;
  LogMessage *other;
  Message *pMVar4;
  ThreadSafeArena *this_01;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (sub_message != (Message *)0x0) {
    this_00 = &(sub_message->super_MessageLite)._internal_metadata_;
    pAVar2 = internal::InternalMetadata::owning_arena(this_00);
    if (pAVar2 != (Arena *)0x0) {
      pAVar3 = internal::InternalMetadata::owning_arena(this_00);
      uVar1 = (message->super_MessageLite)._internal_metadata_.ptr_;
      pAVar2 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar2 = *(Arena **)pAVar2;
      }
      if (pAVar3 != pAVar2) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x7f9);
        other = internal::LogMessage::operator<<
                          (&local_68,
                           "CHECK failed: sub_message == nullptr || sub_message->GetOwningArena() == nullptr || sub_message->GetOwningArena() == message->GetArenaForAllocation(): "
                          );
        internal::LogFinisher::operator=(&local_69,other);
        internal::LogMessage::~LogMessage(&local_68);
      }
    }
    pAVar3 = internal::InternalMetadata::owning_arena(this_00);
    uVar1 = (message->super_MessageLite)._internal_metadata_.ptr_;
    pAVar2 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar2 = *(Arena **)pAVar2;
    }
    if (pAVar3 != pAVar2) {
      pAVar2 = internal::InternalMetadata::owning_arena(this_00);
      if (pAVar2 == (Arena *)0x0) {
        uVar1 = (message->super_MessageLite)._internal_metadata_.ptr_;
        this_01 = (ThreadSafeArena *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          this_01 = *(ThreadSafeArena **)this_01;
        }
        if (this_01 != (ThreadSafeArena *)0x0) {
          internal::ThreadSafeArena::AddCleanup
                    (this_01,sub_message,
                     internal::arena_delete_object<google::protobuf::MessageLite>);
          goto LAB_00396d32;
        }
      }
      pMVar4 = MutableMessage(this,message,field,(MessageFactory *)0x0);
      (*(pMVar4->super_MessageLite)._vptr_MessageLite[0xd])(pMVar4,sub_message);
      return;
    }
  }
LAB_00396d32:
  UnsafeArenaSetAllocatedMessage(this,message,sub_message,field);
  return;
}

Assistant:

void Reflection::SetAllocatedMessage(Message* message, Message* sub_message,
                                     const FieldDescriptor* field) const {
  GOOGLE_DCHECK(sub_message == nullptr || sub_message->GetOwningArena() == nullptr ||
         sub_message->GetOwningArena() == message->GetArenaForAllocation());
  CheckInvalidAccess(schema_, field);

  // If message and sub-message are in different memory ownership domains
  // (different arenas, or one is on heap and one is not), then we may need to
  // do a copy.
  if (sub_message != nullptr &&
      sub_message->GetOwningArena() != message->GetArenaForAllocation()) {
    if (sub_message->GetOwningArena() == nullptr &&
        message->GetArenaForAllocation() != nullptr) {
      // Case 1: parent is on an arena and child is heap-allocated. We can add
      // the child to the arena's Own() list to free on arena destruction, then
      // set our pointer.
      message->GetArenaForAllocation()->Own(sub_message);
      UnsafeArenaSetAllocatedMessage(message, sub_message, field);
    } else {
      // Case 2: all other cases. We need to make a copy. MutableMessage() will
      // either get the existing message object, or instantiate a new one as
      // appropriate w.r.t. our arena.
      Message* sub_message_copy = MutableMessage(message, field);
      sub_message_copy->CopyFrom(*sub_message);
    }
  } else {
    // Same memory ownership domains.
    UnsafeArenaSetAllocatedMessage(message, sub_message, field);
  }
}